

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int EnsureInitialized(BrotliEncoderState *s)

{
  uint uVar1;
  int in_EAX;
  uint uVar2;
  int extraout_EAX;
  int iVar3;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  void *pvVar4;
  
  if (s->is_initialized_ != 0) {
    return in_EAX;
  }
  uVar5 = (s->params).quality;
  uVar2 = 0;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  uVar6 = 0xb;
  if ((int)uVar2 < 0xb) {
    uVar6 = uVar2;
  }
  (s->params).quality = uVar6;
  if ((int)uVar5 < 3) {
    (s->params).large_window = 0;
  }
  uVar2 = (s->params).lgwin;
  if ((int)uVar2 < 10) {
    uVar6 = 10;
  }
  else {
    uVar6 = 0x1e;
    if ((s->params).large_window == 0) {
      uVar6 = 0x18;
    }
    if (uVar2 <= uVar6) goto LAB_00105d56;
  }
  uVar2 = uVar6;
  (s->params).lgwin = uVar2;
LAB_00105d56:
  uVar6 = uVar2;
  if (1 < (int)uVar5) {
    if (uVar5 < 4) {
      uVar6 = 0xe;
    }
    else {
      uVar6 = (s->params).lgblock;
      if (uVar6 == 0) {
        uVar6 = 0x10;
        if (((8 < uVar5) && (0x10 < uVar2)) && (uVar6 = uVar2, 0x11 < uVar2)) {
          uVar6 = 0x12;
        }
      }
      else {
        uVar5 = 0x10;
        if (0x10 < (int)uVar6) {
          uVar5 = uVar6;
        }
        uVar6 = 0x18;
        if ((int)uVar5 < 0x18) {
          uVar6 = uVar5;
        }
      }
    }
  }
  (s->params).lgblock = uVar6;
  ChooseDistanceParams(&s->params);
  s->remaining_metadata_bytes_ = 0xffffffff;
  uVar5 = (s->params).lgwin;
  uVar2 = (s->params).lgblock;
  uVar6 = uVar2;
  if ((int)uVar2 < (int)uVar5) {
    uVar6 = uVar5;
  }
  uVar1 = (s->params).quality;
  uVar8 = 1 << ((char)uVar6 + 1U & 0x1f);
  (s->ringbuffer_).size_ = uVar8;
  (s->ringbuffer_).mask_ = uVar8 - 1;
  uVar7 = 1 << ((byte)uVar2 & 0x1f);
  (s->ringbuffer_).tail_size_ = uVar7;
  uVar2 = 0x12;
  if (0x12 < (int)uVar5) {
    uVar2 = uVar5;
  }
  if (1 < uVar1) {
    uVar2 = uVar5;
  }
  (s->ringbuffer_).total_size_ = uVar7 + uVar8;
  EncodeWindowBits(uVar2,(s->params).large_window,&s->last_bytes_,&s->last_bytes_bits_);
  iVar3 = extraout_EAX;
  if ((s->params).quality == 0) {
    memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
    pvVar4 = memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
    iVar3 = (int)pvVar4;
    s->cmd_code_[0] = 0xff;
    s->cmd_code_[1] = 'w';
    s->cmd_code_[2] = 0xd5;
    s->cmd_code_[3] = 0xbf;
    s->cmd_code_[4] = 0xe7;
    s->cmd_code_[5] = 0xde;
    s->cmd_code_[6] = 0xea;
    s->cmd_code_[7] = 0x9e;
    s->cmd_code_[8] = 'Q';
    s->cmd_code_[9] = ']';
    s->cmd_code_[10] = 0xde;
    s->cmd_code_[0xb] = 0xc6;
    s->cmd_code_[0xc] = 'p';
    s->cmd_code_[0xd] = 'W';
    s->cmd_code_[0xe] = 0xbc;
    s->cmd_code_[0xf] = 'X';
    s->cmd_code_[0x10] = 'X';
    s->cmd_code_[0x11] = 'X';
    s->cmd_code_[0x12] = 0xd8;
    s->cmd_code_[0x13] = 0xd8;
    s->cmd_code_[0x14] = 'X';
    s->cmd_code_[0x15] = 0xd5;
    s->cmd_code_[0x16] = 0xcb;
    s->cmd_code_[0x17] = 0x8c;
    s->cmd_code_[0x18] = 0xea;
    s->cmd_code_[0x19] = 0xe0;
    s->cmd_code_[0x1a] = 0xc3;
    s->cmd_code_[0x1b] = 0x87;
    s->cmd_code_[0x1c] = '\x1f';
    s->cmd_code_[0x1d] = 0x83;
    s->cmd_code_[0x1e] = 0xc1;
    s->cmd_code_[0x1f] = '`';
    s->cmd_code_[0x20] = '\x1c';
    s->cmd_code_[0x21] = 'g';
    s->cmd_code_[0x22] = 0xb2;
    s->cmd_code_[0x23] = 0xaa;
    s->cmd_code_[0x24] = '\x06';
    s->cmd_code_[0x25] = 0x83;
    s->cmd_code_[0x26] = 0xc1;
    s->cmd_code_[0x27] = '`';
    s->cmd_code_[0x28] = '0';
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x30] = 'F';
    s->cmd_code_[0x31] = 0xe1;
    s->cmd_code_[0x32] = 0xb0;
    s->cmd_code_[0x33] = 0xd0;
    s->cmd_code_[0x34] = 'N';
    s->cmd_code_[0x35] = 0xb2;
    s->cmd_code_[0x36] = 0xf7;
    s->cmd_code_[0x37] = '\x04';
    s->cmd_code_[0x38] = '\0';
    s->cmd_code_numbits_ = 0x1c0;
  }
  s->is_initialized_ = 1;
  return iVar3;
}

Assistant:

static BROTLI_BOOL EnsureInitialized(BrotliEncoderState* s) {
  if (BROTLI_IS_OOM(&s->memory_manager_)) return BROTLI_FALSE;
  if (s->is_initialized_) return BROTLI_TRUE;

  SanitizeParams(&s->params);
  s->params.lgblock = ComputeLgBlock(&s->params);
  ChooseDistanceParams(&s->params);

  s->remaining_metadata_bytes_ = BROTLI_UINT32_MAX;

  RingBufferSetup(&s->params, &s->ringbuffer_);

  /* Initialize last byte with stream header. */
  {
    int lgwin = s->params.lgwin;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
        s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
      lgwin = BROTLI_MAX(int, lgwin, 18);
    }
    EncodeWindowBits(lgwin, s->params.large_window,
                     &s->last_bytes_, &s->last_bytes_bits_);
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    InitCommandPrefixCodes(s->cmd_depths_, s->cmd_bits_,
                           s->cmd_code_, &s->cmd_code_numbits_);
  }

  s->is_initialized_ = BROTLI_TRUE;
  return BROTLI_TRUE;
}